

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm.h
# Opt level: O0

bool __thiscall GF2::MM<137UL>::IsDivisibleBy(MM<137UL> *this,MM<137UL> *mRight)

{
  word wVar1;
  WW<137UL> *in_RSI;
  long in_RDI;
  size_t pos;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    if (2 < local_20) {
      return true;
    }
    wVar1 = WW<137UL>::GetWord(in_RSI,local_20);
    if ((wVar1 & (*(ulong *)(in_RDI + local_20 * 8) ^ 0xffffffffffffffff)) != 0) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool IsDivisibleBy(const MM& mRight) const
	{	
		for (size_t pos = 0; pos < _wcount; ++pos)
			if (mRight.GetWord(pos) & ~_words[pos])
				return false;
		return true;
	}